

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall QList<QSqlField>::data(QList<QSqlField> *this)

{
  QArrayDataPointer<QSqlField> *this_00;
  QSqlField *pQVar1;
  QArrayDataPointer<QSqlField> *in_RDI;
  
  detach((QList<QSqlField> *)0x14225c);
  this_00 = (QArrayDataPointer<QSqlField> *)QArrayDataPointer<QSqlField>::operator->(in_RDI);
  pQVar1 = QArrayDataPointer<QSqlField>::data(this_00);
  return pQVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }